

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall bloom_tests::bloom_create_insert_key::test_method(bloom_create_insert_key *this)

{
  long lVar1;
  string *__return_storage_ptr__;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  const_string file;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char *local_160;
  equal_coll_impl local_151;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchPubKey;
  CKey key;
  CBloomFilter filter;
  array<std::byte,_13UL> expected;
  byte local_bb [3];
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_b8;
  long lStack_a0;
  uint160 hash;
  CPubKey pubkey;
  string strSecret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&strSecret,"5Kg1gnAjaLfKiwhhPpGS3QfRg2m6awQvaj98JCZBZQ5SuS2F15C",
             (allocator<char> *)&pubkey);
  DecodeSecret((string *)&key);
  __return_storage_ptr__ = (string *)&pubkey;
  CKey::GetPubKey((CPubKey *)__return_storage_ptr__,&key);
  if ((pubkey.vch[0] & 0xfe) == 2) {
    __return_storage_ptr__ = (string *)(pubkey.vch + 0x21);
  }
  else if ((pubkey.vch[0] < 8) && ((0xd0U >> (pubkey.vch[0] & 0x1f) & 1) != 0)) {
    __return_storage_ptr__ = &strSecret;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchPubKey,pubkey.vch,
             (uchar *)__return_storage_ptr__,(allocator_type *)&filter);
  CBloomFilter::CBloomFilter(&filter,2,0.001,0,'\x01');
  vKey.m_size = (long)vchPubKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)vchPubKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  vKey.m_data = vchPubKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  CBloomFilter::insert(&filter,vKey);
  CPubKey::GetID((CKeyID *)&local_b8,&pubkey);
  hash.super_base_blob<160U>.m_data._M_elems[0x10] =
       (uchar)local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
  hash.super_base_blob<160U>.m_data._M_elems[0x11] =
       local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
  hash.super_base_blob<160U>.m_data._M_elems[0x12] =
       local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
  hash.super_base_blob<160U>.m_data._M_elems[0x13] =
       local_b8._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
  hash.super_base_blob<160U>.m_data._M_elems._0_8_ =
       local_b8._M_impl.super__Vector_impl_data._M_start;
  hash.super_base_blob<160U>.m_data._M_elems._8_8_ =
       local_b8._M_impl.super__Vector_impl_data._M_finish;
  vKey_00.m_size = 0x14;
  vKey_00.m_data = (uchar *)&hash;
  CBloomFilter::insert(&filter,vKey_00);
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_a0 = 0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (byte *)0x0;
  CBloomFilter::SerializationOps<DataStream,CBloomFilter_const,ActionSerialize>(&filter);
  expected._M_elems[8] = 0;
  expected._M_elems[9] = 0;
  expected._M_elems[10] = 0;
  expected._M_elems[0xb] = 0;
  expected._M_elems[0xc] = 1;
  expected._M_elems[0] = 3;
  expected._M_elems[1] = 0x8f;
  expected._M_elems[2] = 0xc1;
  expected._M_elems[3] = 0x6b;
  expected._M_elems[4] = 8;
  expected._M_elems[5] = 0;
  expected._M_elems[6] = 0;
  expected._M_elems[7] = 0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x63;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_150,&local_151,
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )(local_b8._M_impl.super__Vector_impl_data._M_start + lStack_a0),
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )local_b8._M_impl.super__Vector_impl_data._M_finish,expected._M_elems,local_bb);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_180 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_178,1,0xd,4,0xb656dc,(size_t)&local_188,99,"stream.end()",
             "expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_b8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchPubKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  std::__cxx11::string::~string((string *)&strSecret);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_key)
{
    std::string strSecret = std::string("5Kg1gnAjaLfKiwhhPpGS3QfRg2m6awQvaj98JCZBZQ5SuS2F15C");
    CKey key = DecodeSecret(strSecret);
    CPubKey pubkey = key.GetPubKey();
    std::vector<unsigned char> vchPubKey(pubkey.begin(), pubkey.end());

    CBloomFilter filter(2, 0.001, 0, BLOOM_UPDATE_ALL);
    filter.insert(vchPubKey);
    uint160 hash = pubkey.GetID();
    filter.insert(hash);

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"038fc16b080000000000000001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());
}